

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *this)

{
  pointer puVar1;
  pointer puVar2;
  logic_error *this_00;
  int iVar3;
  pointer puVar4;
  anon_class_8_1_ba1d48df f;
  anon_class_8_1_ba1d7400 fun;
  anon_class_8_1_ba1d48df local_28;
  anon_class_8_1_ba1d7400 local_20;
  
  if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar3 = 0x28;
    if (this->dimension_ < 0x28) {
      iVar3 = this->dimension_;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,(long)(iVar3 + 1),(allocator_type *)&local_28);
    local_28.fun = &local_20;
    local_20.res = __return_storage_ptr__;
    if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
      rec_for_each_simplex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::for_each_simplex<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension()const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int)_1_&>(Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension()const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int)_1_&)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,int)_1_&>
                (this,&this->root_,0,&local_28);
    }
    if (this->dimension_to_be_lowered_ == true) {
      puVar2 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*puVar2 == 0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Bug in Gudhi: non-empty complex has no vertex");
LAB_0010ab9e:
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      puVar4 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar4[-1] == 0) {
        do {
          puVar1 = puVar4 + -2;
          puVar4 = puVar4 + -1;
        } while (*puVar1 == 0);
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = puVar4;
      }
      this->dimension_ = (int)((ulong)((long)puVar4 - (long)puVar2) >> 3) + -1;
      this->dimension_to_be_lowered_ = false;
    }
    else if ((__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish[-1] == 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "Bug in Gudhi: there is no simplex of dimension the dimension of the complex");
      goto LAB_0010ab9e;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> num_simplices_by_dimension() const {
    if (is_empty()) return {};
    // std::min in case the upper bound got crazy
    std::vector<size_t> res(std::min(upper_bound_dimension()+1, max_dimension()+1));
    auto fun = [&res](Simplex_handle, int dim) -> void { ++res[dim]; };
    for_each_simplex(fun);
    if (dimension_to_be_lowered_) {
      GUDHI_CHECK(res.front() != 0, std::logic_error("Bug in Gudhi: non-empty complex has no vertex"));
      while (res.back() == 0) res.pop_back();
      dimension_ = static_cast<int>(res.size()) - 1;
      dimension_to_be_lowered_ = false;
    } else {
      GUDHI_CHECK(res.back() != 0,
          std::logic_error("Bug in Gudhi: there is no simplex of dimension the dimension of the complex"));
    }
    return res;
  }